

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderMoveToAttribute(xmlTextReaderPtr reader,xmlChar *name)

{
  int iVar1;
  xmlChar *str2;
  xmlNodePtr pxVar2;
  xmlChar *prefix;
  xmlChar *local_28;
  
  local_28 = (xmlChar *)0x0;
  if (name == (xmlChar *)0x0 || reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  if (reader->node == (xmlNodePtr)0x0) {
    return -1;
  }
  if (reader->node->type == XML_ELEMENT_NODE) {
    str2 = xmlSplitQName4(name,&local_28);
    if (str2 == (xmlChar *)0x0) {
      xmlTextReaderErrMemory(reader);
      return -1;
    }
    if (local_28 == (xmlChar *)0x0) {
      iVar1 = xmlStrEqual(name,"xmlns");
      if (iVar1 != 0) {
        pxVar2 = (xmlNodePtr)&reader->node->nsDef;
        do {
          pxVar2 = (xmlNodePtr)pxVar2->_private;
          if (pxVar2 == (xmlNodePtr)0x0) {
            return 0;
          }
        } while (pxVar2->children != (_xmlNode *)0x0);
        reader->curnode = pxVar2;
        return 1;
      }
      for (pxVar2 = (xmlNodePtr)reader->node->properties; pxVar2 != (xmlNodePtr)0x0;
          pxVar2 = pxVar2->next) {
        iVar1 = xmlStrEqual(pxVar2->name,name);
        if ((iVar1 != 0) && ((pxVar2->ns == (xmlNs *)0x0 || (pxVar2->ns->prefix == (xmlChar *)0x0)))
           ) {
          reader->curnode = pxVar2;
          return 1;
        }
      }
    }
    else {
      iVar1 = xmlStrEqual(local_28,"xmlns");
      if (iVar1 == 0) {
        for (pxVar2 = (xmlNodePtr)reader->node->properties; pxVar2 != (xmlNodePtr)0x0;
            pxVar2 = pxVar2->next) {
          iVar1 = xmlStrEqual(pxVar2->name,str2);
          if (((iVar1 != 0) && (pxVar2->ns != (xmlNs *)0x0)) &&
             (iVar1 = xmlStrEqual(pxVar2->ns->prefix,local_28), iVar1 != 0)) goto LAB_0017854a;
        }
      }
      else {
        for (pxVar2 = (xmlNodePtr)reader->node->nsDef; pxVar2 != (xmlNodePtr)0x0;
            pxVar2 = (xmlNodePtr)pxVar2->_private) {
          if ((pxVar2->children != (_xmlNode *)0x0) &&
             (iVar1 = xmlStrEqual((xmlChar *)pxVar2->children,str2), iVar1 != 0)) {
LAB_0017854a:
            reader->curnode = pxVar2;
            if (local_28 != (xmlChar *)0x0) {
              (*xmlFree)(local_28);
            }
            return 1;
          }
        }
      }
      if (local_28 != (xmlChar *)0x0) {
        (*xmlFree)(local_28);
      }
    }
  }
  return 0;
}

Assistant:

int
xmlTextReaderMoveToAttribute(xmlTextReaderPtr reader, const xmlChar *name) {
    xmlChar *prefix = NULL;
    const xmlChar *localname;
    xmlNsPtr ns;
    xmlAttrPtr prop;

    if ((reader == NULL) || (name == NULL))
	return(-1);
    if (reader->node == NULL)
	return(-1);

    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(0);

    localname = xmlSplitQName4(name, &prefix);
    if (localname == NULL) {
        xmlTextReaderErrMemory(reader);
        return(-1);
    }
    if (prefix == NULL) {
	/*
	 * Namespace default decl
	 */
	if (xmlStrEqual(name, BAD_CAST "xmlns")) {
	    ns = reader->node->nsDef;
	    while (ns != NULL) {
		if (ns->prefix == NULL) {
		    reader->curnode = (xmlNodePtr) ns;
		    return(1);
		}
		ns = ns->next;
	    }
	    return(0);
	}

	prop = reader->node->properties;
	while (prop != NULL) {
	    /*
	     * One need to have
	     *   - same attribute names
	     *   - and the attribute carrying that namespace
	     */
	    if ((xmlStrEqual(prop->name, name)) &&
		((prop->ns == NULL) || (prop->ns->prefix == NULL))) {
		reader->curnode = (xmlNodePtr) prop;
		return(1);
	    }
	    prop = prop->next;
	}
	return(0);
    }

    /*
     * Namespace default decl
     */
    if (xmlStrEqual(prefix, BAD_CAST "xmlns")) {
	ns = reader->node->nsDef;
	while (ns != NULL) {
	    if ((ns->prefix != NULL) && (xmlStrEqual(ns->prefix, localname))) {
		reader->curnode = (xmlNodePtr) ns;
		goto found;
	    }
	    ns = ns->next;
	}
	goto not_found;
    }
    prop = reader->node->properties;
    while (prop != NULL) {
	/*
	 * One need to have
	 *   - same attribute names
	 *   - and the attribute carrying that namespace
	 */
	if ((xmlStrEqual(prop->name, localname)) &&
	    (prop->ns != NULL) && (xmlStrEqual(prop->ns->prefix, prefix))) {
	    reader->curnode = (xmlNodePtr) prop;
	    goto found;
	}
	prop = prop->next;
    }
not_found:
    if (prefix != NULL)
        xmlFree(prefix);
    return(0);

found:
    if (prefix != NULL)
        xmlFree(prefix);
    return(1);
}